

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

Token * __thiscall Lexer::next_token(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  byte bVar5;
  lexer_exception *plVar6;
  byte bVar7;
  stringstream buffer;
  string local_1d8;
  undefined1 local_1b8 [24];
  char local_1a0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178 [13];
  
  bVar7 = this->npos;
  bVar5 = this->current_;
  if (bVar5 != bVar7) {
    do {
      if (this->in_row_comment_ == true) {
        if (bVar5 != 10 && bVar5 != bVar7) {
          do {
            advance(this);
            bVar7 = this->npos;
            bVar5 = this->current_;
            if (bVar5 == 10) break;
          } while (bVar5 != bVar7);
        }
        this->in_row_comment_ = false;
      }
      else {
        if (this->in_block_comment_ == true) {
          while (this->current_ != this->npos) {
            if (this->current_ != '*') {
              do {
                advance(this);
                cVar1 = this->current_;
                if (cVar1 == '*') break;
              } while (cVar1 != this->npos);
              if (cVar1 == this->npos) {
                plVar6 = (lexer_exception *)__cxa_allocate_exception(0x38);
                local_1b8._0_8_ = local_1b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b8,anon_var_dwarf_48cb8,anon_var_dwarf_48cb8 + 0x15);
                lexer_exception::lexer_exception(plVar6,&this->position_,(string *)local_1b8);
                __cxa_throw(plVar6,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
              }
            }
            match_times((Token *)local_1b8,this);
            uVar4 = local_1b8._0_4_;
            if (local_1b8._0_4_ == kRightBlockComment) {
              this->in_block_comment_ = false;
              iVar2 = (this->position_).super_Position.row_;
              iVar3 = (this->position_).super_Position.col_;
              __return_storage_ptr__->type_ = kRightBlockComment;
              (__return_storage_ptr__->content_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->content_).field_2;
              (__return_storage_ptr__->content_)._M_string_length = 0;
              (__return_storage_ptr__->content_).field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->position_).super_Position.row_ = iVar2;
              (__return_storage_ptr__->position_).super_Position.col_ = iVar3;
              (__return_storage_ptr__->position_).super_Position._vptr_Position =
                   (_func_int **)&PTR_clear_00153a10;
              (__return_storage_ptr__->position_).length_ = 2;
              (__return_storage_ptr__->extra_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (__return_storage_ptr__->extra_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->extra_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_178);
            if ((char *)local_1b8._8_8_ != local_1a0) {
              operator_delete((void *)local_1b8._8_8_);
            }
            if (uVar4 == kRightBlockComment) {
              return __return_storage_ptr__;
            }
          }
          break;
        }
        if (bVar5 < 0xd) {
          if (1 < bVar5 - 9) goto switchD_00122c72_caseD_2e;
        }
        else if (bVar5 < 0x20) {
          if (bVar5 != 0xd) goto switchD_00122c72_caseD_2e;
        }
        else {
          if (0x27 < bVar5) {
            if (bVar5 < 0x5b) {
              switch(bVar5) {
              case 0x28:
                match_left_paren(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x29:
                match_right_paren(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x2a:
                match_times(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x2b:
                match_plus(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x2c:
                match_comma(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x2d:
                match_minus(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x2f:
                match_divide(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x3b:
                match_semicolon(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x3c:
                match_lt(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x3d:
                match_equal(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              case 0x3e:
                match_gt(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              }
            }
            else if (bVar5 < 0x7b) {
              if (bVar5 == 0x5b) {
                match_left_bracket(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              }
              if (bVar5 == 0x5d) {
                match_right_bracket(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              }
            }
            else {
              if (bVar5 == 0x7b) {
                match_left_brace(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              }
              if (bVar5 == 0x7d) {
                match_right_brace(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              }
            }
switchD_00122c72_caseD_2e:
            if ((0x19 < (byte)(bVar5 + 0x9f)) && (bVar5 != 0x5f && 0x19 < (byte)(bVar5 + 0xbf))) {
              if ((byte)(bVar5 - 0x30) < 10) {
                match_digit(__return_storage_ptr__,this);
                return __return_storage_ptr__;
              }
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),anon_var_dwarf_48cd1,0x14);
              local_1d8._M_dataplus._M_p._0_1_ = this->current_;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),(char *)&local_1d8,1);
              plVar6 = (lexer_exception *)__cxa_allocate_exception(0x38);
              std::__cxx11::stringbuf::str();
              lexer_exception::lexer_exception(plVar6,&this->position_,&local_1d8);
              __cxa_throw(plVar6,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
            }
            match_name(__return_storage_ptr__,this);
            return __return_storage_ptr__;
          }
          if (bVar5 != 0x20) goto switchD_00122c72_caseD_2e;
        }
        skip_whitespace(this);
        bVar7 = this->npos;
        bVar5 = this->current_;
      }
    } while (bVar5 != bVar7);
  }
  iVar2 = (this->position_).super_Position.row_;
  iVar3 = (this->position_).super_Position.col_;
  __return_storage_ptr__->type_ = kEOF;
  (__return_storage_ptr__->content_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content_).field_2;
  (__return_storage_ptr__->content_)._M_string_length = 0;
  (__return_storage_ptr__->content_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->position_).super_Position.row_ = iVar2;
  (__return_storage_ptr__->position_).super_Position.col_ = iVar3;
  (__return_storage_ptr__->position_).super_Position._vptr_Position =
       (_func_int **)&PTR_clear_00153a10;
  (__return_storage_ptr__->position_).length_ = 0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->extra_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::next_token() {
    while (current_ != npos) {
        if (in_row_comment_) {  // 在行注释中
            while (current_ != npos && !Recognition::is_newline(current_)) {
                consume(false);
            }
            in_row_comment_ = false;
            continue;
        }
        if (in_block_comment_) {  // 在块注释中
            while (current_ != npos) {
                while (current_ != npos && current_ != '*') {
                    consume(false);
                }
                if (current_ == npos) {
                    throw lexer_exception(position_, "未闭合的注释块");
                } else {
                    Token t = match_times();
                    if (t.type() == Token::Type::kRightBlockComment) {
                        in_block_comment_ = false;
                        return Token(Token::Type::kRightBlockComment, TokenPosition(position_, 2));
                    }
                }
            }
            continue;  // 保证 EOF 会被正确处理
        }

        switch (current_) {
            case ' ':
            case '\t':
            case '\n':
            case '\r':
                skip_whitespace();
                continue;
            case '(': return match_left_paren();
            case ')': return match_right_paren();
            case '[': return match_left_bracket();
            case ']': return match_right_bracket();
            case '{': return match_left_brace();
            case '}': return match_right_brace();
            case ';': return match_semicolon();
            case ',': return match_comma();
            case '=': return match_equal();
            case '+': return match_plus();
            case '-': return match_minus();
            case '*': return match_times();
            case '/': return match_divide();
            case '<': return match_lt();
            case '>': return match_gt();
            default:
                if (Recognition::is_letter(current_)) {
                    return match_name();
                } else if (Recognition::is_digit(current_)) {
                    return match_digit();
                } else {
                    std::stringstream buffer;
                    buffer << "不合法的字符: " << current_;
                    throw lexer_exception(position_, buffer.str());
                }
        }
    }
    return Token(Token::Type::kEOF, TokenPosition(position_, 0));
}